

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::SkipList
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,KeyComparator *cmp,
          Arena *arena)

{
  long lVar1;
  Node *pNVar2;
  char *in_RDX;
  Node *in_RDI;
  long in_FS_OFFSET;
  int i;
  Node *in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffffa4;
  atomic<leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Node_*> *this_00;
  int local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = in_RDI;
  MemTable::KeyComparator::KeyComparator
            ((KeyComparator *)in_stack_ffffffffffffff98,(KeyComparator *)0xd2a88c);
  pNVar2[1].key = in_RDX;
  this_00 = pNVar2[1].next_;
  pNVar2 = NewNode((SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)this_00,&pNVar2->key,
                   (int)((ulong)in_RDI >> 0x20));
  (this_00->_M_b)._M_p = pNVar2;
  std::atomic<int>::atomic((atomic<int> *)in_stack_ffffffffffffff98,0);
  Random::Random((Random *)in_RDI,in_stack_ffffffffffffffa4);
  for (local_38 = 0; local_38 < 0xc; local_38 = local_38 + 1) {
    Node::SetNext(in_RDI,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SkipList<Key, Comparator>::SkipList(Comparator cmp, Arena* arena)
    : compare_(cmp),
      arena_(arena),
      head_(NewNode(0 /* any key will do */, kMaxHeight)),
      max_height_(1),
      rnd_(0xdeadbeef) {
  for (int i = 0; i < kMaxHeight; i++) {
    head_->SetNext(i, nullptr);
  }
}